

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O2

string * __thiscall
kratos::FSMState::handle_name_abi_cxx11_(string *__return_storage_ptr__,FSMState *this)

{
  FSM *pFVar1;
  FSM *pFVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  string_view format_str;
  format_args args;
  string local_78;
  pointer local_58;
  size_type sStack_50;
  pointer local_48;
  size_type sStack_40;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name_);
  pFVar2 = this->parent_;
  while (pFVar1 = pFVar2->parent_fsm_, pFVar1 != (FSM *)0x0) {
    local_58 = (pFVar2->fsm_name_)._M_dataplus._M_p;
    sStack_50 = (pFVar2->fsm_name_)._M_string_length;
    local_48 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sStack_40 = __return_storage_ptr__->_M_string_length;
    bVar3 = fmt::v7::to_string_view<char,_0>("{0}_{1}");
    format_str.data_ = (char *)bVar3.size_;
    format_str.size_ = 0xdd;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_58;
    fmt::v7::detail::vformat_abi_cxx11_(&local_78,(detail *)bVar3.data_,format_str,args);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    pFVar2 = pFVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FSMState::handle_name() const {
    auto str = name_;
    auto* current = parent_;
    auto* p = parent_->parent_fsm();
    while (p) {
        str = ::format("{0}_{1}", current->fsm_name(), str);
        current = p;
        p = p->parent_fsm();
    }
    return str;
}